

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

void __thiscall libtorrent::aux::torrent::set_state(torrent *this,state_t s)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ulong uVar2;
  _List_node_base *p_Var3;
  bool bVar4;
  state_t local_3c;
  state_t local_24;
  
  if (((state_t)((ulong)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48 >> 0x39) &
      checking_resume_data) == s) {
    return;
  }
  local_3c = s;
  iVar1 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [5])();
  if ((*(uint *)(CONCAT44(extraout_var,iVar1) + 0x68) & 0x40) != 0) {
    iVar1 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [5])();
    get_handle((torrent *)&stack0xffffffffffffffc8);
    local_24 = (state_t)((ulong)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48 >> 0x39
                        ) & checking_resume_data;
    alert_manager::
    emplace_alert<libtorrent::state_changed_alert,libtorrent::torrent_handle,libtorrent::torrent_status::state_t_const&,libtorrent::torrent_status::state_t>
              ((alert_manager *)CONCAT44(extraout_var_00,iVar1),
               (torrent_handle *)&stack0xffffffffffffffc8,&local_3c,&stack0xffffffffffffffdc);
    ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
              ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffd0);
    s = local_3c;
  }
  if ((s == finished) &&
     (iVar1 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[5])(),
     (*(uint *)(CONCAT44(extraout_var_01,iVar1) + 0x68) & 0x40) != 0)) {
    iVar1 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [5])();
    get_handle((torrent *)&stack0xffffffffffffffc8);
    alert_manager::emplace_alert<libtorrent::torrent_finished_alert,libtorrent::torrent_handle>
              ((alert_manager *)CONCAT44(extraout_var_02,iVar1),
               (torrent_handle *)&stack0xffffffffffffffc8);
    ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
              ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffd0);
  }
  if ((this->field_0x5cc & 0x10) == 0) {
    uVar2 = *(ulong *)&(this->super_torrent_hot_members).field_0x48;
  }
  else {
    uVar2 = *(ulong *)&(this->super_torrent_hot_members).field_0x48;
    if (3 < ((uint)(uVar2 >> 0x39) & 6) - 2) {
      bVar4 = local_3c - downloading_metadata < 4;
      goto LAB_002ced5c;
    }
  }
  bVar4 = false;
LAB_002ced5c:
  *(ulong *)&(this->super_torrent_hot_members).field_0x48 =
       uVar2 & 0xf1ffffffffffffff | (ulong)(local_3c & checking_resume_data) << 0x39;
  update_gauge(this);
  update_want_peers(this);
  update_want_tick(this);
  update_state_list(this);
  state_updated(this);
  (*(this->super_request_callback)._vptr_request_callback[7])
            (this,"set_state() %d",
             (ulong)((uint)((ulong)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48 >>
                           0x39) & 7));
  if (bVar4) {
    (*(this->super_request_callback)._vptr_request_callback[7])(this);
    auto_managed(this,false);
    pause(this);
    this->field_0x5cc = this->field_0x5cc & 0xef;
  }
  p_Var3 = (_List_node_base *)&this->m_extensions;
  while (p_Var3 = (((_List_base<std::shared_ptr<libtorrent::torrent_plugin>,_std::allocator<std::shared_ptr<libtorrent::torrent_plugin>_>_>
                     *)&p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var3 != (_List_node_base *)&this->m_extensions) {
    (**(code **)(*(long *)p_Var3[1]._M_next + 0x48))
              (p_Var3[1]._M_next,
               (uint)((ulong)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48 >> 0x39) &
               7);
  }
  return;
}

Assistant:

void torrent::set_state(torrent_status::state_t const s)
	{
		TORRENT_ASSERT(is_single_thread());
		TORRENT_ASSERT(s != 0); // this state isn't used anymore

#if TORRENT_USE_ASSERTS

		if (s == torrent_status::seeding)
		{
			TORRENT_ASSERT(is_seed());
			TORRENT_ASSERT(is_finished());
		}
		if (s == torrent_status::finished)
			TORRENT_ASSERT(is_finished());
		if (s == torrent_status::downloading && m_state == torrent_status::finished)
			TORRENT_ASSERT(!is_finished());
#endif

		if (int(m_state) == s) return;

		if (m_ses.alerts().should_post<state_changed_alert>())
		{
			m_ses.alerts().emplace_alert<state_changed_alert>(get_handle()
				, s, static_cast<torrent_status::state_t>(m_state));
		}

		if (s == torrent_status::finished
			&& alerts().should_post<torrent_finished_alert>())
		{
			alerts().emplace_alert<torrent_finished_alert>(
				get_handle());
		}

		bool const trigger_stop = m_stop_when_ready
			&& !is_downloading_state(m_state)
			&& is_downloading_state(s);

		// we need to update the state before calling pause(), because otherwise
		// it may think we're still checking files, even though we're just
		// leaving that state
		m_state = s;

		update_gauge();
		update_want_peers();
		update_want_tick();
		update_state_list();

		state_updated();

#ifndef TORRENT_DISABLE_LOGGING
		debug_log("set_state() %d", m_state);
#endif

		if (trigger_stop)
		{
#ifndef TORRENT_DISABLE_LOGGING
			debug_log("stop_when_ready triggered");
#endif
			// stop_when_ready is set, and we're transitioning from a downloading
			// state to a non-downloading state. pause the torrent. Note that
			// "downloading" is defined broadly to include any state where we
			// either upload or download (for the purpose of this flag).
			auto_managed(false);
			pause();
			m_stop_when_ready = false;
		}

#ifndef TORRENT_DISABLE_EXTENSIONS
		for (auto& ext : m_extensions)
		{
			ext->on_state(state());
		}
#endif
	}